

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void llvm::cl::
     apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
               (opt<bool,_false,_llvm::cl::parser<bool>_> *O,OptionHidden *M,initializer<bool> *Ms,
               cat *Ms_1,sub *Ms_2)

{
  sub *Ms_local_2;
  cat *Ms_local_1;
  initializer<bool> *Ms_local;
  OptionHidden *M_local;
  opt<bool,_false,_llvm::cl::parser<bool>_> *O_local;
  
  applicator<llvm::cl::OptionHidden>::opt(*M,&O->super_Option);
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            (O,Ms,Ms_1,Ms_2);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}